

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::loadwallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff498;
  uint uVar1;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff4a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d0;
  allocator<char> *in_stack_fffffffffffff4d8;
  char *in_stack_fffffffffffff4e0;
  undefined7 in_stack_fffffffffffff4e8;
  undefined1 in_stack_fffffffffffff4ef;
  string *in_stack_fffffffffffff4f0;
  undefined7 in_stack_fffffffffffff4f8;
  undefined1 in_stack_fffffffffffff4ff;
  undefined4 in_stack_fffffffffffff500;
  Type in_stack_fffffffffffff504;
  string *in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff510;
  Type in_stack_fffffffffffff514;
  undefined4 in_stack_fffffffffffff518;
  Type in_stack_fffffffffffff51c;
  RPCResult *in_stack_fffffffffffff520;
  undefined1 *local_ad0;
  undefined1 *local_ab8;
  undefined1 *local_aa0;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  allocator<char> local_91e;
  allocator<char> local_91d;
  allocator<char> local_91c;
  allocator<char> local_91b [3];
  pointer local_918;
  pointer pRStack_910;
  pointer local_908;
  undefined8 in_stack_fffffffffffff700;
  allocator<char> local_8da;
  allocator<char> local_8d9 [31];
  allocator<char> local_8ba;
  undefined1 local_8b9 [31];
  undefined1 local_89a;
  vector<RPCArg,_std::allocator<RPCArg>_> local_899;
  undefined1 local_87a;
  undefined1 local_879 [8];
  allocator<char> local_871;
  undefined4 local_870;
  allocator<char> local_869 [31];
  allocator<char> local_84a;
  allocator<char> local_849 [321];
  undefined1 local_708 [136];
  undefined1 local_680 [128];
  undefined1 local_600 [272];
  undefined1 local_4f0 [200];
  undefined1 local_428;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined1 local_3e7;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [264];
  RPCHelpMan local_150;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_870 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4a8,(Optional *)in_stack_fffffffffffff4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff4b0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff498);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                 in_stack_fffffffffffff508,in_stack_fffffffffffff504,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                 in_stack_fffffffffffff4f0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8));
  this_01 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_879._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff4a8,(Optional *)in_stack_fffffffffffff4a0);
  name = (string *)local_879;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_428 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff4b0);
  local_400 = 0;
  uStack_3f8 = 0;
  local_3f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff498);
  local_3e8 = 0;
  local_3e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                 in_stack_fffffffffffff508,in_stack_fffffffffffff504,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                 in_stack_fffffffffffff4f0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8));
  description = (string *)&local_87a;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff498);
  __l._M_len._0_7_ = in_stack_fffffffffffff4e8;
  __l._M_array = (iterator)in_stack_fffffffffffff4e0;
  __l._M_len._7_1_ = in_stack_fffffffffffff4ef;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4d8,__l,
             (allocator_type *)in_stack_fffffffffffff4d0);
  args = &local_899;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  results = (RPCResults *)&local_89a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  examples = (RPCExamples *)local_8b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_8d9[1] = (allocator<char>)0x0;
  local_8d9[2] = (allocator<char>)0x0;
  local_8d9[3] = (allocator<char>)0x0;
  local_8d9[4] = (allocator<char>)0x0;
  local_8d9[5] = (allocator<char>)0x0;
  local_8d9[6] = (allocator<char>)0x0;
  local_8d9[7] = (allocator<char>)0x0;
  local_8d9[8] = (allocator<char>)0x0;
  local_8d9[9] = (allocator<char>)0x0;
  local_8d9[10] = (allocator<char>)0x0;
  local_8d9[0xb] = (allocator<char>)0x0;
  local_8d9[0xc] = (allocator<char>)0x0;
  local_8d9[0xd] = (allocator<char>)0x0;
  local_8d9[0xe] = (allocator<char>)0x0;
  local_8d9[0xf] = (allocator<char>)0x0;
  local_8d9[0x10] = (allocator<char>)0x0;
  local_8d9[0x11] = (allocator<char>)0x0;
  local_8d9[0x12] = (allocator<char>)0x0;
  local_8d9[0x13] = (allocator<char>)0x0;
  local_8d9[0x14] = (allocator<char>)0x0;
  local_8d9[0x15] = (allocator<char>)0x0;
  local_8d9[0x16] = (allocator<char>)0x0;
  local_8d9[0x17] = (allocator<char>)0x0;
  local_8d9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  RPCResult::RPCResult
            (in_stack_fffffffffffff520,in_stack_fffffffffffff51c,
             (string *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff508,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
             (bool)in_stack_fffffffffffff4ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  local_918 = (pointer)0x0;
  pRStack_910 = (pointer)0x0;
  local_908 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  RPCResult::RPCResult
            (in_stack_fffffffffffff520,in_stack_fffffffffffff51c,
             (string *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff508,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
             (bool)in_stack_fffffffffffff4ff);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff498);
  uVar1 = (uint)((ulong)in_stack_fffffffffffff498 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff4e8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff4e0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff4ef;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff4d0);
  this = (allocator<RPCResult> *)((ulong)uVar1 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             in_stack_fffffffffffff514,in_stack_fffffffffffff508,
             SUB41(in_stack_fffffffffffff504 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4f0,
             (bool)in_stack_fffffffffffff4ef);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff4e8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff4e0;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff4ef;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4d8,__l_01,
             (allocator_type *)in_stack_fffffffffffff4d0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff520,in_stack_fffffffffffff51c,
             (string *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff508,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
             (bool)in_stack_fffffffffffff4ff);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  HelpExampleCli(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),in_stack_fffffffffffff4e0
             ,in_stack_fffffffffffff4d8);
  HelpExampleRpc(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  std::operator+(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x9e1c32);
  this_00 = (RPCArg *)&stack0xfffffffffffff6c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::loadwallet()::__0,void>(in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff700);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_91e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_91d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_91c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_91b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_aa0 = local_4f0;
  do {
    local_aa0 = local_aa0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_aa0 != local_600);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_ab8 = local_680;
  do {
    local_ab8 = local_ab8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_ab8 != local_708);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4a8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff706);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff707);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_8da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_8d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4a8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_8ba);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_8b9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_89a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_ad0 = local_48;
  do {
    local_ad0 = local_ad0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_ad0 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_879);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_879 + 7));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_871);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_869);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_84a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_849);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan loadwallet()
{
    return RPCHelpMan{"loadwallet",
                "\nLoads a wallet from a wallet file or directory."
                "\nNote that all wallet command-line options used when starting bitcoind will be"
                "\napplied to the new wallet.\n",
                {
                    {"filename", RPCArg::Type::STR, RPCArg::Optional::NO, "The wallet directory or .dat file."},
                    {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "name", "The wallet name if loaded successfully."},
                        {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to loading the wallet.",
                        {
                            {RPCResult::Type::STR, "", ""},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("loadwallet", "\"test.dat\"")
            + HelpExampleRpc("loadwallet", "\"test.dat\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    WalletContext& context = EnsureWalletContext(request.context);
    const std::string name(request.params[0].get_str());

    DatabaseOptions options;
    DatabaseStatus status;
    ReadDatabaseArgs(*context.args, options);
    options.require_existing = true;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    std::optional<bool> load_on_start = request.params[1].isNull() ? std::nullopt : std::optional<bool>(request.params[1].get_bool());

    {
        LOCK(context.wallets_mutex);
        if (std::any_of(context.wallets.begin(), context.wallets.end(), [&name](const auto& wallet) { return wallet->GetName() == name; })) {
            throw JSONRPCError(RPC_WALLET_ALREADY_LOADED, "Wallet \"" + name + "\" is already loaded.");
        }
    }

    std::shared_ptr<CWallet> const wallet = LoadWallet(context, name, load_on_start, options, status, error, warnings);

    HandleWalletError(wallet, status, error);

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("name", wallet->GetName());
    PushWarnings(warnings, obj);

    return obj;
},
    };
}